

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_states.cpp
# Opt level: O2

bool __thiscall AActor::HasSpecialDeathStates(AActor *this)

{
  long lVar1;
  long *plVar2;
  FStateLabels *pFVar3;
  PClass *pPVar4;
  FStateLabel *pFVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  bool bVar9;
  FName local_4;
  
  pPVar4 = DObject::GetClass((DObject *)this);
  pFVar3 = *(FStateLabels **)
            &pPVar4[1].super_PNativeStruct.super_PStruct.super_PNamedType.super_PCompoundType.
             super_PType.Align;
  if ((pFVar3 == (FStateLabels *)0x0) ||
     (pFVar5 = FStateLabels::FindLabel(pFVar3,&local_4), pFVar5 == (FStateLabel *)0x0)) {
    uVar6 = 0;
  }
  else {
    pFVar3 = pFVar5->Children;
    uVar6 = 0;
    if (pFVar3 != (FStateLabels *)0x0) {
      uVar7 = (ulong)(uint)pFVar3->NumLabels;
      if (pFVar3->NumLabels < 1) {
        uVar7 = uVar6;
      }
      lVar8 = 0;
      do {
        lVar1 = lVar8 + 0x18;
        bVar9 = uVar7 * 0x18 + 0x18 == lVar1;
        uVar6 = (ulong)!bVar9;
        if (bVar9) break;
        plVar2 = (long *)((long)&pFVar3->Labels[0].State + lVar8);
        lVar8 = lVar1;
      } while (*plVar2 == 0);
    }
  }
  return SUB81(uVar6,0);
}

Assistant:

bool AActor::HasSpecialDeathStates () const
{
	const PClassActor *info = static_cast<PClassActor *>(GetClass());

	if (info->StateList != NULL)
	{
		FStateLabel *slabel = info->StateList->FindLabel (NAME_Death);
		if (slabel != NULL && slabel->Children != NULL)
		{
			for(int i = 0; i < slabel->Children->NumLabels; i++)
			{
				if (slabel->Children->Labels[i].State != NULL)
				{
					return true;
				}
			}
		}
	}
	return false;
}